

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O0

void Cut_CellSuppMin(Cut_Cell_t *pCell)

{
  char cVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  int Temp;
  int Counter;
  int k;
  int i;
  uint *pTemp;
  uint *pOut;
  uint *pIn;
  Cut_Cell_t *pCell_local;
  
  Temp = *(uint *)&pCell->field_0x20 & 0xf;
  while (Temp = Temp - 1, -1 < Temp) {
    iVar4 = Extra_TruthVarInSupport(pCell->uTruth,*(uint *)&pCell->field_0x20 & 0xf,Temp);
    if (iVar4 == 0) {
      bVar3 = false;
      pOut = pCell->uTruth;
      pTemp = Cut_CellSuppMin::uTemp;
      for (Counter = Temp; puVar2 = pOut, Counter < (int)((*(uint *)&pCell->field_0x20 & 0xf) - 1);
          Counter = Counter + 1) {
        Extra_TruthSwapAdjacentVars(pTemp,pOut,*(uint *)&pCell->field_0x20 & 0xf,Counter);
        pOut = pTemp;
        pTemp = puVar2;
        cVar1 = pCell->CanonPerm[Counter];
        pCell->CanonPerm[Counter] = pCell->CanonPerm[Counter + 1];
        pCell->CanonPerm[Counter + 1] = cVar1;
        bVar3 = (bool)(bVar3 ^ 1);
      }
      if (bVar3) {
        Extra_TruthCopy(pTemp,pOut,*(uint *)&pCell->field_0x20 & 0xf);
      }
      *(uint *)&pCell->field_0x20 =
           *(uint *)&pCell->field_0x20 & 0xfffffff0 | (*(uint *)&pCell->field_0x20 & 0xf) - 1 & 0xf;
    }
  }
  return;
}

Assistant:

void Cut_CellSuppMin( Cut_Cell_t * pCell )
{
    static unsigned uTemp[1<<(CUT_CELL_MVAR-5)];
    unsigned * pIn, * pOut, * pTemp;
    int i, k, Counter, Temp;

    // go backward through the support variables and remove redundant
    for ( k = pCell->nVars - 1; k >= 0; k-- )
        if ( !Extra_TruthVarInSupport(pCell->uTruth, pCell->nVars, k) )
        {
            // shift all the variables above this one
            Counter = 0;
            pIn = pCell->uTruth; pOut = uTemp;
            for ( i = k; i < (int)pCell->nVars - 1; i++ )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, pCell->nVars, i );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                // swap the support vars
                Temp = pCell->CanonPerm[i]; 
                pCell->CanonPerm[i] = pCell->CanonPerm[i+1];
                pCell->CanonPerm[i+1] = Temp;
                Counter++;
            }
            // return the function back into its place
            if ( Counter & 1 )
                Extra_TruthCopy( pOut, pIn, pCell->nVars );
            // remove one variable
            pCell->nVars--;
//            Extra_PrintBinary( stdout, pCell->uTruth, (1<<pCell->nVars) ); printf( "\n" );
        }
}